

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O1

void __thiscall cmListFileParser::IssueError(cmListFileParser *this,string *text)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *__s;
  cmListFileBacktrace lfbt;
  cmListFileContext lfc;
  cmListFileBacktrace cStack_b8;
  cmListFileContext local_98;
  cmListFileBacktrace local_50;
  
  paVar1 = &local_98.Name.field_2;
  local_98.Name._M_string_length = 0;
  local_98.Name.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_98.FilePath.field_2;
  local_98.FilePath._M_string_length = 0;
  local_98.FilePath.field_2._M_local_buf[0] = '\0';
  local_98.Line = 0;
  __s = this->FileName;
  local_98.Name._M_dataplus._M_p = (pointer)paVar1;
  local_98.FilePath._M_dataplus._M_p = (pointer)paVar2;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&local_98.FilePath,0,(char *)0x0,(ulong)__s);
  local_98.Line = cmListFileLexer_GetCurrentLine(this->Lexer);
  cmListFileBacktrace::cmListFileBacktrace(&cStack_b8,&this->Backtrace);
  cmListFileBacktrace::cmListFileBacktrace(&local_50,&cStack_b8.Bottom,cStack_b8.Cur,&local_98);
  cmListFileBacktrace::operator=(&cStack_b8,&local_50);
  if (local_50.Cur != (Entry *)0x0) {
    cmListFileBacktrace::Entry::Unref(local_50.Cur);
  }
  cmMessenger::IssueMessage(this->Messenger,FATAL_ERROR,text,&cStack_b8);
  cmSystemTools::s_FatalErrorOccured = true;
  if (cStack_b8.Cur != (Entry *)0x0) {
    cmListFileBacktrace::Entry::Unref(cStack_b8.Cur);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.FilePath._M_dataplus._M_p != paVar2) {
    operator_delete(local_98.FilePath._M_dataplus._M_p,
                    CONCAT71(local_98.FilePath.field_2._M_allocated_capacity._1_7_,
                             local_98.FilePath.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.Name._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.Name._M_dataplus._M_p,
                    CONCAT71(local_98.Name.field_2._M_allocated_capacity._1_7_,
                             local_98.Name.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmListFileParser::IssueError(const std::string& text) const
{
  cmListFileContext lfc;
  lfc.FilePath = this->FileName;
  lfc.Line = cmListFileLexer_GetCurrentLine(this->Lexer);
  cmListFileBacktrace lfbt = this->Backtrace;
  lfbt = lfbt.Push(lfc);
  this->Messenger->IssueMessage(cmake::FATAL_ERROR, text, lfbt);
  cmSystemTools::SetFatalErrorOccured();
}